

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

int __thiscall Fl_Text_Buffer::next_char(Fl_Text_Buffer *this,int pos)

{
  int iVar1;
  char c;
  int iVar2;
  
  c = byte_at(this,pos);
  iVar2 = fl_utf8len1(c);
  iVar1 = iVar2 + pos;
  if (this->mLength <= iVar2 + pos) {
    iVar1 = this->mLength;
  }
  return iVar1;
}

Assistant:

int Fl_Text_Buffer::next_char(int pos) const
{
  IS_UTF8_ALIGNED2(this, (pos))  
  int n = fl_utf8len1(byte_at(pos));
  pos += n;
  if (pos>=mLength)
    return mLength;
  IS_UTF8_ALIGNED2(this, (pos))  
  return pos;
}